

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

void __thiscall TokenScanner::~TokenScanner(TokenScanner *this)

{
  TokenScanner *this_local;
  
  this->_vptr_TokenScanner = (_func_int **)&PTR__TokenScanner_00117a70;
  if (((this->stringInputFlag & 1U) != 0) && (this->isp != (istream *)0x0)) {
    (**(code **)(*(long *)this->isp + 8))();
  }
  std::__cxx11::string::~string((string *)&this->wordChars);
  std::__cxx11::string::~string((string *)&this->buffer);
  return;
}

Assistant:

TokenScanner::~TokenScanner() {
   if (stringInputFlag) delete isp;
}